

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O3

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::find_item_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t *slot_id,uint64_t quo)

{
  pointer puVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  ulong uVar8;
  
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (this->table_).width_;
  uVar5 = *slot_id;
  do {
    uVar3 = uVar6 * uVar5;
    uVar4 = (ulong)((uint)uVar3 & 0x3f);
    if (uVar6 + uVar4 < 0x41) {
      uVar3 = puVar1[uVar3 >> 6] >> uVar4;
    }
    else {
      bVar2 = (byte)uVar3 & 0x3f;
      uVar3 = puVar1[uVar3 >> 6] >> bVar2 | puVar1[(uVar3 >> 6) + 1] << 0x40 - bVar2;
    }
    uVar3 = (uVar3 & (this->table_).mask_) >> ((ulong)(byte)this->quo_shift_ & 0x3f);
    if (uVar3 == quo) break;
    uVar5 = uVar5 + 1 & (this->capa_size_).mask_;
    *slot_id = uVar5;
    uVar6 = (this->table_).width_;
    uVar4 = uVar6 * uVar5;
    uVar8 = (ulong)((uint)uVar4 & 0x3f);
    if (uVar8 + uVar6 < 0x41) {
      uVar7 = (uint)(puVar1[uVar4 >> 6] >> uVar8);
    }
    else {
      bVar2 = (byte)uVar4 & 0x3f;
      uVar7 = (uint)(puVar1[uVar4 >> 6] >> bVar2) | (uint)(puVar1[(uVar4 >> 6) + 1] << 0x40 - bVar2)
      ;
    }
  } while ((uVar7 & (uint)(this->table_).mask_ & 1) == 0);
  return uVar3 == quo;
}

Assistant:

bool find_item_(uint64_t& slot_id, uint64_t quo) const {
        do {
            if (get_quo_(slot_id) == quo) {
                return true;
            }
            slot_id = right_(slot_id);
        } while (!get_cbit_(slot_id));
        return false;
    }